

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

int loader_impl_load_from_memory
              (plugin_manager manager,plugin p,loader_impl impl,char *buffer,size_t size,
              void **handle_ptr)

{
  int iVar1;
  loader_impl_interface iface;
  long lVar2;
  ulong uVar3;
  loader_handle module;
  loader_handle_impl handle_impl_00;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  loader_handle_impl handle_impl;
  loader_name name;
  loader_handle_impl local_140;
  char local_138 [264];
  
  if (((size != 0 && (buffer != (char *)0x0 && impl != (loader_impl)0x0)) &&
      (iface = (loader_impl_interface)plugin_iface(p), iface != (loader_impl_interface)0x0)) &&
     (iVar1 = loader_impl_initialize(manager,p,impl), iVar1 == 0)) {
    iVar1 = loader_impl_load_from_memory_name(impl,local_138,buffer,size);
    if (iVar1 == 0) {
      lVar2 = set_get(impl->handle_impl_path_map,local_138);
      if (lVar2 == 0) {
        uVar3 = vector_size(impl->handle_impl_init_order);
        vector_push_back_empty(impl->handle_impl_init_order);
        module = (*iface->load_from_memory)(impl,local_138,buffer,size);
        if (module == (loader_handle)0x0) {
          while( true ) {
            uVar3 = uVar3 + 1;
            uVar5 = vector_size(impl->handle_impl_init_order);
            if (uVar5 <= uVar3) break;
            puVar4 = (undefined8 *)vector_at(impl->handle_impl_init_order,uVar3);
            loader_impl_destroy_handle((loader_handle_impl)*puVar4);
          }
          vector_pop_back(impl->handle_impl_init_order);
        }
        else {
          handle_impl_00 = loader_impl_load_handle(impl,iface,module,local_138,0xff);
          if (handle_impl_00 != (loader_handle_impl)0x0) {
            handle_impl_00->populated = 1;
            local_140 = handle_impl_00;
            iVar1 = set_insert(impl->handle_impl_path_map,handle_impl_00->path,handle_impl_00);
            if (iVar1 == 0) {
              iVar1 = set_insert(impl->handle_impl_map,handle_impl_00->module,handle_impl_00);
              if (iVar1 == 0) {
                iVar1 = (*iface->discover)(impl,handle_impl_00->module,handle_impl_00->ctx);
                if ((iVar1 == 0) &&
                   (iVar1 = loader_impl_handle_register
                                      (manager,impl,local_138,handle_impl_00,handle_ptr), iVar1 == 0
                   )) {
                  vector_set(impl->handle_impl_init_order,uVar3,&local_140);
                  return 0;
                }
                set_remove(impl->handle_impl_map,handle_impl_00->module);
              }
              set_remove(impl->handle_impl_path_map,handle_impl_00->path);
            }
            while( true ) {
              uVar3 = uVar3 + 1;
              uVar5 = vector_size(impl->handle_impl_init_order);
              if (uVar5 <= uVar3) break;
              puVar4 = (undefined8 *)vector_at(impl->handle_impl_init_order,uVar3);
              loader_impl_destroy_handle((loader_handle_impl)*puVar4);
            }
            vector_pop_back(impl->handle_impl_init_order);
            log_write_impl_va("metacall",0x437,"loader_impl_load_from_memory",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                              ,3,"Error when loading handle: %s",local_138);
            loader_impl_destroy_handle(handle_impl_00);
          }
        }
        return 1;
      }
      pcVar7 = "Load from memory handle failed, handle with name %s already loaded";
      uVar6 = 0x400;
    }
    else {
      pcVar7 = "Load from memory handle failed, name could not be generated correctly";
      uVar6 = 0x3f9;
    }
    log_write_impl_va("metacall",uVar6,"loader_impl_load_from_memory",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                      ,3,pcVar7);
  }
  return 1;
}

Assistant:

int loader_impl_load_from_memory(plugin_manager manager, plugin p, loader_impl impl, const char *buffer, size_t size, void **handle_ptr)
{
	if (impl != NULL && buffer != NULL && size > 0)
	{
		loader_impl_interface iface = loader_iface(p);

		/* TODO: Disable logs here until log is completely thread safe and async signal safe */
		/* log_write("metacall", LOG_LEVEL_DEBUG, "Loading from memory %.10s...", buffer); */

		if (iface != NULL)
		{
			loader_name name;
			loader_handle handle = NULL;
			size_t init_order;

			if (loader_impl_initialize(manager, p, impl) != 0)
			{
				return 1;
			}

			if (loader_impl_load_from_memory_name(impl, name, buffer, size) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Load from memory handle failed, name could not be generated correctly");

				return 1;
			}

			if (loader_impl_get_handle(impl, name) != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Load from memory handle failed, handle with name %s already loaded", name);

				return 1;
			}

			init_order = vector_size(impl->handle_impl_init_order);

			vector_push_back_empty(impl->handle_impl_init_order);

			handle = iface->load_from_memory(impl, name, buffer, size);

			/* TODO: Disable logs here until log is completely thread safe and async signal safe */
			/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader interface: %p - Loader handle: %p", (void *)iface, (void *)handle); */

			if (handle != NULL)
			{
				loader_handle_impl handle_impl = loader_impl_load_handle(impl, iface, handle, name, LOADER_NAME_SIZE);

				if (handle_impl != NULL)
				{
					handle_impl->populated = 1;

					if (set_insert(impl->handle_impl_path_map, handle_impl->path, handle_impl) == 0)
					{
						if (set_insert(impl->handle_impl_map, handle_impl->module, handle_impl) == 0)
						{
							if (iface->discover(impl, handle_impl->module, handle_impl->ctx) == 0)
							{
								if (loader_impl_handle_register(manager, impl, name, handle_impl, handle_ptr) == 0)
								{
									vector_set_var(impl->handle_impl_init_order, init_order, handle_impl);

									return 0;
								}
							}

							set_remove(impl->handle_impl_map, handle_impl->module);
						}

						set_remove(impl->handle_impl_path_map, handle_impl->path);
					}

					{
						size_t iterator;

						for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
						{
							loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

							loader_impl_destroy_handle(iterator_handle_impl);
						}

						vector_pop_back(impl->handle_impl_init_order);
					}

					log_write("metacall", LOG_LEVEL_ERROR, "Error when loading handle: %s", name);

					loader_impl_destroy_handle(handle_impl);
				}
			}
			else
			{
				size_t iterator;

				for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
				{
					loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

					loader_impl_destroy_handle(iterator_handle_impl);
				}

				vector_pop_back(impl->handle_impl_init_order);
			}
		}
	}

	return 1;
}